

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O0

void __thiscall
CsSignal::PendingSlot::PendingSlot
          (PendingSlot *this,SignalBase *sender,
          unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
          *signal_Bento,SlotBase *receiver,
          unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
          *slot_Bento,
          unique_ptr<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
          *teaCup_Data)

{
  unique_ptr<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
  *teaCup_Data_local;
  unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  *slot_Bento_local;
  SlotBase *receiver_local;
  unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  *signal_Bento_local;
  SignalBase *sender_local;
  PendingSlot *this_local;
  
  this->m_sender = sender;
  std::
  unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  ::unique_ptr(&this->m_signal_Bento,signal_Bento);
  this->m_receiver = receiver;
  std::
  unique_ptr<CsSignal::Internal::BentoAbstract,_std::default_delete<CsSignal::Internal::BentoAbstract>_>
  ::unique_ptr(&this->m_slot_Bento,slot_Bento);
  std::
  unique_ptr<CsSignal::Internal::TeaCupAbstract,_std::default_delete<CsSignal::Internal::TeaCupAbstract>_>
  ::unique_ptr(&this->m_teaCup_Data,teaCup_Data);
  return;
}

Assistant:

CsSignal::PendingSlot::PendingSlot(SignalBase *sender, std::unique_ptr<Internal::BentoAbstract> signal_Bento,
                  SlotBase *receiver, std::unique_ptr<Internal::BentoAbstract> slot_Bento,
                  std::unique_ptr<Internal::TeaCupAbstract> teaCup_Data)
   : m_sender(sender), m_signal_Bento(std::move(signal_Bento)), m_receiver(receiver),
     m_slot_Bento(std::move(slot_Bento)), m_teaCup_Data(std::move(teaCup_Data))
{
}